

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O2

void libdef_func(BuildCtx *ctx,char *p,int arg)

{
  uint8_t **ppuVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  FILE *pFVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (arg != 0) {
    ffasmfunc = ffasmfunc + 1;
  }
  switch(ctx->mode) {
  case BUILD_ffdef:
    pFVar6 = (FILE *)ctx->fp;
    pcVar5 = "FFDEF(%s)\n";
    break;
  case BUILD_libdef:
    if (modstate != 0) {
      if (regfunc == 1) {
        if (&optr < optr + 1) {
          fwrite("Error: output buffer overflow\n",0x1e,1,_stderr);
          goto LAB_0010ad9c;
        }
        ppuVar1 = (uint8_t **)(optr + 1);
        *optr = 0xfe;
        optr = (uint8_t *)ppuVar1;
      }
      else {
        if (arg != 0x80) {
          if (modstate != 1) {
            fwrite(",\n",2,1,(FILE *)ctx->fp);
          }
          modstate = 2;
          pcVar5 = "lj_cf_";
          if (arg != 0) {
            pcVar5 = "lj_ffh_";
          }
          fprintf((FILE *)ctx->fp,"  %s%s",pcVar5,p);
        }
        if (regfunc == 2) {
          p = "";
        }
        else {
          obuf[2] = obuf[2] + '\x01';
        }
        libdef_name(p,arg);
      }
      goto LAB_0010ac25;
    }
    pcVar5 = "Error: no module for function definition %s\n";
    goto LAB_0010adc8;
  case BUILD_recdef:
    sVar3 = strlen(p);
    if (sVar3 < 0x50) {
      strcpy(funcname,p);
      goto LAB_0010ac25;
    }
    pcVar5 = "Error: function name too long: \'%s\'\n";
LAB_0010adc8:
    fprintf(_stderr,pcVar5,p);
LAB_0010ad9c:
    exit(1);
  case BUILD_vmdef:
    for (lVar4 = 0; (p[lVar4 + 1] != '\0' && (modname[lVar4] != '\0')); lVar4 = lVar4 + 1) {
      if (p[lVar4 + 1] == '_') {
        p[lVar4 + 1] = '.';
      }
    }
    pFVar6 = (FILE *)ctx->fp;
    pcVar5 = "\"%s\",\n";
    break;
  default:
    if (ctx->mode != BUILD_bcdef || arg == 0) goto LAB_0010ac25;
    pFVar6 = (FILE *)ctx->fp;
    uVar7 = 0;
    uVar8 = (ulong)(uint)ctx->nglob;
    if (ctx->nglob < 1) {
      uVar8 = uVar7;
    }
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      pcVar5 = ctx->globnames[uVar7];
      if ((((*pcVar5 == 'f') && (pcVar5[1] == 'f')) && (pcVar5[2] == '_')) &&
         (iVar2 = strcmp(pcVar5 + 3,p), iVar2 == 0)) {
        fprintf(pFVar6,",\n%d",(ulong)(uint)(*(int *)(ctx->glob + uVar7) - *(int *)&ctx->code));
        goto LAB_0010ac25;
      }
    }
    fprintf(_stderr,"Error: undefined fast function %s%s\n","lj_ff_",p);
    goto LAB_0010ad9c;
  }
  fprintf(pFVar6,pcVar5,p);
LAB_0010ac25:
  ffid = ffid + 1;
  regfunc = 0;
  return;
}

Assistant:

static void libdef_func(BuildCtx *ctx, char *p, int arg)
{
  if (arg != LIBINIT_CF)
    ffasmfunc++;
  if (ctx->mode == BUILD_libdef) {
    if (modstate == 0) {
      fprintf(stderr, "Error: no module for function definition %s\n", p);
      exit(1);
    }
    if (regfunc == REGFUNC_NOREG) {
      if (optr+1 > obuf+sizeof(obuf)) {
	fprintf(stderr, "Error: output buffer overflow\n");
	exit(1);
      }
      *optr++ = LIBINIT_FFID;
    } else {
      if (arg != LIBINIT_ASM_) {
	if (modstate != 1) fprintf(ctx->fp, ",\n");
	modstate = 2;
	fprintf(ctx->fp, "  %s%s", arg ? LABEL_PREFIX_FFH : LABEL_PREFIX_CF, p);
      }
      if (regfunc != REGFUNC_NOREGUV) obuf[2]++;  /* Bump hash table size. */
      libdef_name(regfunc == REGFUNC_NOREGUV ? "" : p, arg);
    }
  } else if (ctx->mode == BUILD_ffdef) {
    fprintf(ctx->fp, "FFDEF(%s)\n", p);
  } else if (ctx->mode == BUILD_recdef) {
    if (strlen(p) > sizeof(funcname)-1) {
      fprintf(stderr, "Error: function name too long: '%s'\n", p);
      exit(1);
    }
    strcpy(funcname, p);
  } else if (ctx->mode == BUILD_vmdef) {
    int i;
    for (i = 1; p[i] && modname[i-1]; i++)
      if (p[i] == '_') p[i] = '.';
    fprintf(ctx->fp, "\"%s\",\n", p);
  } else if (ctx->mode == BUILD_bcdef) {
    if (arg != LIBINIT_CF)
      fprintf(ctx->fp, ",\n%d", find_ffofs(ctx, p));
  }
  ffid++;
  regfunc = REGFUNC_OK;
}